

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

int __thiscall
slang::ast::AssertionPortSymbol::clone
          (AssertionPortSymbol *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  Compilation *pCVar1;
  AssertionPortSymbol *this_00;
  Scope *scope;
  SyntaxNode *syntax;
  AssertionPortSymbol *result;
  Compilation *comp;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  BumpAllocator *in_stack_ffffffffffffffd0;
  __extent_storage<18446744073709551615UL> _Var2;
  
  pCVar1 = Scope::getCompilation((Scope *)__fn);
  this_00 = BumpAllocator::
            emplace<slang::ast::AssertionPortSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&>
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(SourceLocation *)this);
  DeclaredType::setLink(&this_00->declaredType,&this->declaredType);
  this_00->defaultValueSyntax = this->defaultValueSyntax;
  (this_00->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::ArgumentDirection> =
       (this->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload.
       super__Optional_payload_base<slang::ast::ArgumentDirection>;
  scope = (Scope *)Symbol::getSyntax(&this->super_Symbol);
  if (scope != (Scope *)0x0) {
    Symbol::setSyntax(&this_00->super_Symbol,(SyntaxNode *)scope);
    _Var2._M_extent_value = (size_t)__fn;
    slang::syntax::SyntaxNode::as<slang::syntax::AssertionItemPortSyntax>((SyntaxNode *)scope);
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               this,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn);
    syntax_00._M_extent._M_extent_value = _Var2._M_extent_value;
    syntax_00._M_ptr = (pointer)pCVar1;
    Symbol::setAttributes(&this_00->super_Symbol,scope,syntax_00);
  }
  return (int)this_00;
}

Assistant:

AssertionPortSymbol& AssertionPortSymbol::clone(Scope& newScope) const {
    auto& comp = newScope.getCompilation();
    auto result = comp.emplace<AssertionPortSymbol>(name, location);
    result->declaredType.setLink(declaredType);
    result->defaultValueSyntax = defaultValueSyntax;
    result->direction = direction;

    if (auto syntax = getSyntax()) {
        result->setSyntax(*syntax);
        result->setAttributes(newScope, syntax->as<AssertionItemPortSyntax>().attributes);
    }

    return *result;
}